

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WLANOptimizer.cpp
# Opt level: O3

void __thiscall WLANOptimizerThread::Stop(WLANOptimizerThread *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  unique_lock<std::mutex> wakeLocker;
  unique_lock<std::mutex> local_20;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    if ((this->Thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      LOCK();
      (this->Terminated)._M_base._M_i = true;
      UNLOCK();
      local_20._M_device = &this->WakeLock;
      local_20._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_20);
      local_20._M_owns = true;
      std::condition_variable::notify_all();
      std::unique_lock<std::mutex>::~unique_lock(&local_20);
      if ((((this->Thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _M_id)._M_thread != 0) {
        std::thread::join();
      }
      this_00 = (this->Thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->Thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->Thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void WLANOptimizerThread::Stop()
{
    std::lock_guard<std::mutex> startStopLocker(StartStopLock);

    if (Thread)
    {
        Terminated = true;

        // Make sure that queue notification happens after termination flag is set
        {
            std::unique_lock<std::mutex> wakeLocker(WakeLock);
            WakeCondition.notify_all();
        }

        // Wait for thread to stop
        try
        {
            if (Thread->joinable()) {
                Thread->join();
            }
        }
        catch (std::system_error& /*err*/)
        {
        }

        Thread = nullptr;
    }
}